

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  int iVar1;
  Expr *zRight;
  int iVar2;
  long lVar3;
  
  if (((char)pEList->nExpr == ';') && (iVar1 = *(int *)&pParse->db, 0 < (long)iVar1)) {
    zRight = pEList->a[0].pExpr;
    lVar3 = 0;
    do {
      if ((&pParse->pVdbe)[lVar3 * 4] != (Vdbe *)0x0) {
        iVar2 = sqlite3StrICmp((char *)(&pParse->pVdbe)[lVar3 * 4],(char *)zRight);
        if (iVar2 == 0) {
          return (int)lVar3 + 1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar1);
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    char *zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      char *zAs = pEList->a[i].zName;
      if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
        return i+1;
      }
    }
  }
  return 0;
}